

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O0

container_t * convert_run_to_efficient_container(run_container_t *c,uint8_t *typecode_after)

{
  int iVar1;
  int32_t iVar2;
  int32_t iVar3;
  int iVar4;
  undefined1 *in_RSI;
  array_container_t *in_RDI;
  int end;
  int start;
  int rlepos_1;
  bitset_container_t *answer;
  int run_value;
  int run_end;
  int run_start;
  int rlepos;
  array_container_t *answer_1;
  int32_t min_size_non_run;
  int32_t size_as_array_container;
  int32_t card;
  int32_t size_as_bitset_container;
  int32_t size_as_run_container;
  undefined4 in_stack_ffffffffffffff98;
  int32_t in_stack_ffffffffffffff9c;
  int local_60;
  int local_54;
  uint local_48;
  int local_3c;
  array_container_t *local_8;
  
  iVar2 = run_container_serialized_size_in_bytes(in_RDI->cardinality);
  iVar3 = bitset_container_serialized_size_in_bytes();
  iVar4 = run_container_cardinality
                    ((run_container_t *)
                     CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
  local_60 = array_container_serialized_size_in_bytes(iVar4);
  if (iVar3 < local_60) {
    local_60 = iVar3;
  }
  if (local_60 < iVar2) {
    if (iVar4 < 0x1001) {
      local_8 = array_container_create_given_capacity(in_stack_ffffffffffffff9c);
      local_8->cardinality = 0;
      for (local_3c = 0; local_3c < in_RDI->cardinality; local_3c = local_3c + 1) {
        local_48 = (uint)in_RDI->array[(long)local_3c * 2];
        iVar4 = local_48 + in_RDI->array[(long)local_3c * 2 + 1];
        for (; (int)local_48 <= iVar4; local_48 = local_48 + 1) {
          iVar1 = local_8->cardinality;
          local_8->cardinality = iVar1 + 1;
          local_8->array[iVar1] = (uint16_t)local_48;
        }
      }
      *in_RSI = 2;
    }
    else {
      local_8 = (array_container_t *)bitset_container_create();
      for (local_54 = 0; local_54 < in_RDI->cardinality; local_54 = local_54 + 1) {
        bitset_set_range((uint64_t *)local_8->array,(uint)in_RDI->array[(long)local_54 * 2],
                         (uint)in_RDI->array[(long)local_54 * 2] +
                         (uint)in_RDI->array[(long)local_54 * 2 + 1] + 1);
      }
      local_8->cardinality = iVar4;
      *in_RSI = 1;
    }
  }
  else {
    *in_RSI = 3;
    local_8 = in_RDI;
  }
  return local_8;
}

Assistant:

container_t *convert_run_to_efficient_container(run_container_t *c,
                                                uint8_t *typecode_after) {
    int32_t size_as_run_container =
        run_container_serialized_size_in_bytes(c->n_runs);

    int32_t size_as_bitset_container =
        bitset_container_serialized_size_in_bytes();
    int32_t card = run_container_cardinality(c);
    int32_t size_as_array_container =
        array_container_serialized_size_in_bytes(card);

    int32_t min_size_non_run =
        size_as_bitset_container < size_as_array_container
            ? size_as_bitset_container
            : size_as_array_container;
    if (size_as_run_container <= min_size_non_run) {  // no conversion
        *typecode_after = RUN_CONTAINER_TYPE;
        return c;
    }
    if (card <= DEFAULT_MAX_SIZE) {
        // to array
        array_container_t *answer = array_container_create_given_capacity(card);
        answer->cardinality = 0;
        for (int rlepos = 0; rlepos < c->n_runs; ++rlepos) {
            int run_start = c->runs[rlepos].value;
            int run_end = run_start + c->runs[rlepos].length;

            for (int run_value = run_start; run_value <= run_end; ++run_value) {
                answer->array[answer->cardinality++] = (uint16_t)run_value;
            }
        }
        *typecode_after = ARRAY_CONTAINER_TYPE;
        return answer;
    }

    // else to bitset
    bitset_container_t *answer = bitset_container_create();

    for (int rlepos = 0; rlepos < c->n_runs; ++rlepos) {
        int start = c->runs[rlepos].value;
        int end = start + c->runs[rlepos].length;
        bitset_set_range(answer->words, start, end + 1);
    }
    answer->cardinality = card;
    *typecode_after = BITSET_CONTAINER_TYPE;
    return answer;
}